

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O1

void __thiscall HMatrix::rp_mtx(HMatrix *this)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  vector<double,_std::allocator<double>_> rp_mtx_r;
  vector<double,_std::allocator<double>_> local_58;
  value_type_conflict1 local_38;
  
  if (this->numRow + this->numCol < 0x15) {
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_58,(long)this->numCol,&local_38);
    puts("\nRow-wise matrix");
    printf("         ");
    if (0 < this->numCol) {
      uVar6 = 0;
      do {
        printf(" %8d",(ulong)uVar6);
        uVar6 = uVar6 + 1;
      } while ((int)uVar6 < this->numCol);
    }
    putchar(10);
    if (0 < this->numRow) {
      uVar7 = 0;
      do {
        printf(" Row %2d: ",uVar7 & 0xffffffff);
        iVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        lVar5 = (long)iVar1;
        iVar2 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        if (iVar1 < iVar2) {
          piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[piVar3[lVar5]] = pdVar4[lVar5];
            lVar5 = lVar5 + 1;
          } while (iVar2 != lVar5);
        }
        if (0 < this->numCol) {
          lVar5 = 0;
          do {
            printf(" %8g",SUB84(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start[lVar5],0));
            lVar5 = lVar5 + 1;
          } while (lVar5 < this->numCol);
        }
        putchar(10);
        iVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        lVar5 = (long)iVar1;
        iVar2 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        if (iVar1 < iVar2) {
          piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[piVar3[lVar5]] = 0.0;
            lVar5 = lVar5 + 1;
          } while (iVar2 != lVar5);
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)this->numRow);
    }
    if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HMatrix::rp_mtx() {
	if (numRow+numCol>20) return;
    vector<double> rp_mtx_r;
    rp_mtx_r.assign(numCol, 0);

	printf("\nRow-wise matrix\n");
	printf("         ");
	for (int i = 0; i < numCol; i++) {
		printf(" %8d", i);
	}
	printf("\n");

    for (int i = 0; i < numRow; i++) {
		printf(" Row %2d: ", i);
        for (int k = ARstart[i]; k < AR_Nend[i]; k++) {
        	rp_mtx_r[ARindex[k]] = ARvalue[k];
        }
        for (int k = 0; k < numCol; k++) {
        	printf(" %8g", rp_mtx_r[k]);
        }
    	printf("\n");
        for (int k = ARstart[i]; k < AR_Nend[i]; k++) {
        	 rp_mtx_r[ARindex[k]] = 0;
        }
    }

}